

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

mcmcxdef *
mcmcini(mcmcx1def *globalctx,uint pages,_func_void_void_ptr_mclhd_uchar_ptr_ushort *loadfn,
       void *loadctx,_func_void_void_ptr_mcmon *revertfn,void *revertctx)

{
  mcmcxdef *pmVar1;
  void *in_RCX;
  _func_void_void_ptr_mclhd_uchar_ptr_ushort *in_RDX;
  uint in_ESI;
  mcmcx1def *in_RDI;
  _func_void_void_ptr_mcmon *in_R8;
  errcxdef *in_R9;
  ushort siz;
  mcmcxdef *ret;
  undefined6 in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  
  pmVar1 = (mcmcxdef *)
           mchalo(in_R9,in_stack_ffffffffffffffc8,
                  (char *)CONCAT26(((short)in_ESI + -1) * 8 + 0x38,in_stack_ffffffffffffffc0));
  pmVar1->mcmcxmsz = in_ESI;
  pmVar1->mcmcxgl = in_RDI;
  pmVar1->mcmcxldf = in_RDX;
  pmVar1->mcmcxldc = in_RCX;
  pmVar1->mcmcxrvf = in_R8;
  pmVar1->mcmcxrvc = in_R9;
  pmVar1->mcmcxflg = 0;
  memset(pmVar1->mcmcxmtb,0,(ulong)in_ESI << 3);
  return pmVar1;
}

Assistant:

mcmcxdef *mcmcini(mcmcx1def *globalctx, uint pages,
                  void (*loadfn)(void *, mclhd, uchar *, ushort),
                  void *loadctx,
                  void (*revertfn)(void *, mcmon), void *revertctx)
{
    mcmcxdef *ret;
    ushort    siz;
    
    siz = sizeof(mcmcxdef) + sizeof(mcmon *) * (pages - 1);
    IF_DEBUG(siz += sizeof(ulong));
    
    ret = (mcmcxdef *)mchalo(globalctx->mcmcxerr, siz, "mcm client context");
    IF_DEBUG((*(ulong *)ret = 0x02020202,
              ret = (mcmcxdef *)((uchar *)ret + sizeof(ulong))));

    ret->mcmcxmsz = pages;
    ret->mcmcxgl = globalctx;
    ret->mcmcxldf = loadfn;
    ret->mcmcxldc = loadctx;
    ret->mcmcxrvf = revertfn;
    ret->mcmcxrvc = revertctx;
    ret->mcmcxflg = 0;
    memset(ret->mcmcxmtb, 0, (size_t)(pages * sizeof(mcmon *)));
    return(ret);
}